

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unames.cpp
# Opt level: O0

UBool icu_63::enumExtNames(UChar32 start,UChar32 end,UEnumCharNamesFn *fn,void *context)

{
  UBool UVar1;
  uint16_t uVar2;
  char local_f8 [6];
  uint16_t length;
  char buffer [200];
  void *context_local;
  UEnumCharNamesFn *fn_local;
  uint32_t local_10;
  UChar32 end_local;
  UChar32 start_local;
  
  local_10 = start;
  if (fn != (UEnumCharNamesFn *)0x0) {
    for (; (int)local_10 <= end; local_10 = local_10 + 1) {
      uVar2 = getExtName(local_10,local_f8,200);
      local_f8[uVar2] = '\0';
      if ((uVar2 != 0) &&
         (UVar1 = (*fn)(context,local_10,U_EXTENDED_CHAR_NAME,local_f8,(int32_t)uVar2),
         UVar1 == '\0')) {
        return '\0';
      }
    }
  }
  return '\x01';
}

Assistant:

static UBool
enumExtNames(UChar32 start, UChar32 end,
             UEnumCharNamesFn *fn, void *context)
{
    if(fn!=DO_FIND_NAME) {
        char buffer[200];
        uint16_t length;
        
        while(start<=end) {
            buffer[length = getExtName(start, buffer, sizeof(buffer))] = 0;
            /* here, we assume that the buffer is large enough */
            if(length>0) {
                if(!fn(context, start, U_EXTENDED_CHAR_NAME, buffer, length)) {
                    return FALSE;
                }
            }
            ++start;
        }
    }

    return TRUE;
}